

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classic.cpp
# Opt level: O1

bool __thiscall ClassicMapGenerator::generate(ClassicMapGenerator *this)

{
  undefined8 uVar1;
  pointer pAVar2;
  int iVar3;
  long lVar4;
  Area area;
  Area local_38;
  
  do_rooms(this);
  lVar4 = 0;
  do {
    if ((*(byte *)((long)(this->rooms[0].r_exit + -1) + lVar4) & 2) == 0) {
      Area::Area(&local_38);
      pAVar2 = areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.super__Vector_impl_data
               ._M_finish;
      uVar1 = *(undefined8 *)((long)this->rooms[0].r_exit + lVar4 + -0x1c);
      local_38.position.y = (int)((ulong)uVar1 >> 0x20);
      local_38.position.y = local_38.position.y + 1;
      local_38.position.x = (int)uVar1 + 1;
      uVar1 = *(undefined8 *)((long)this->rooms[0].r_exit + lVar4 + -0x14);
      local_38.size.y = (int)((ulong)uVar1 >> 0x20);
      local_38.size.y = local_38.size.y + -2;
      local_38.size.x = (int)uVar1 + -2;
      if (areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<Area,std::allocator<Area>>::_M_realloc_insert<Area_const&>
                  ((vector<Area,std::allocator<Area>> *)&areas,
                   (iterator)
                   areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        (areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.super__Vector_impl_data.
        _M_finish)->flags = local_38.flags;
        pAVar2->position = local_38.position;
        pAVar2->size = local_38.size;
        areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.super__Vector_impl_data.
        _M_finish = areas.super__Vector_base<Area,_std::allocator<Area>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    lVar4 = lVar4 + 0x7c;
  } while (lVar4 != 0x45c);
  do_passages(this);
  if ((amulet == false) && (level == max_level)) {
    iVar3 = rnd(0x14);
    if (iVar3 == 0) {
      treas_room(this);
    }
  }
  placeRandomItems();
  placeAmuletIfRequired();
  placeRandomTraps();
  placeRandomStairs();
  placeRandomHero();
  return true;
}

Assistant:

bool ClassicMapGenerator::generate()
{
    do_rooms();     /* Draw rooms */
    //Build the area definitions from the room definitions.
    for(int n=0; n<MAXROOMS; n++)
    {
        if (rooms[n].r_flags & ISGONE)
            continue;
        Area area;
        area.position = rooms[n].r_pos;
        area.position.x += 1;
        area.position.y += 1;
        area.size = rooms[n].r_max;
        area.size.x -= 2;
        area.size.y -= 2;
        areas.push_back(area);
    }
    do_passages();  /* Draw passages */

    /*
     * check for treasure rooms, and if so, put it in.
     */
    if (!amulet && level == max_level && rnd(TREAS_ROOM) == 0)
        treas_room();

    placeRandomItems();
    placeAmuletIfRequired();
    placeRandomTraps();
    placeRandomStairs();
    placeRandomHero();
    
    return true;
}